

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cpp
# Opt level: O3

string * __thiscall Array::asString_abi_cxx11_(string *__return_storage_ptr__,Array *this)

{
  element_type *peVar1;
  pointer psVar2;
  long *plVar3;
  long *plVar4;
  pointer psVar5;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  peVar1 = (this->values).
           super___shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  psVar5 = (peVar1->
           super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->
           super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar2) {
    do {
      (*(((psVar5->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member).
        _vptr_Member[2])(local_50);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar2);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Array::asString() {
    std::string result = "[";

    for(ptr<Value>& value : *values) {
        result += value -> asString() + ", ";
    }

    result.pop_back();
    result.pop_back();

    result += "]";

    return result;
}